

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O2

void at_your_feet(char *str)

{
  char *pcVar1;
  char *pcVar2;
  char *line;
  char *pcVar3;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00216b15;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00216b10;
    if ((u._1052_1_ & 1) == 0) goto LAB_00216b5c;
  }
  else {
LAB_00216b10:
    if (ublindf == (obj *)0x0) {
LAB_00216b1b:
      str = "Something";
    }
    else {
LAB_00216b15:
      if (ublindf->oartifact != '\x1d') goto LAB_00216b1b;
    }
    if ((u._1052_1_ & 1) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
LAB_00216b5c:
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00216b7f;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00216b7a;
LAB_00216b85:
        pcVar1 = vtense(str,"appear");
      }
      else {
LAB_00216b7a:
        if (ublindf != (obj *)0x0) {
LAB_00216b7f:
          if (ublindf->oartifact == '\x1d') goto LAB_00216b85;
        }
        pcVar1 = "lands";
      }
      if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
        pcVar3 = "at";
        if ((youmonst.data)->mlet == '\x05') {
          pcVar3 = "beneath";
        }
      }
      else {
        pcVar3 = "beneath";
      }
      pcVar2 = body_part(5);
      pcVar2 = makeplural(pcVar2);
      line = "%s %s %s your %s!";
      goto LAB_00216c36;
    }
  }
  pcVar1 = vtense(str,"drop");
  pcVar3 = mon_nam(u.ustuck);
  pcVar3 = s_suffix(pcVar3);
  pcVar2 = mbodypart(u.ustuck,0x12);
  line = "%s %s into %s %s.";
LAB_00216c36:
  pline(line,str,pcVar1,pcVar3,pcVar2);
  return;
}

Assistant:

static void at_your_feet(const char *str)
{
	if (Blind) str = "Something";
	if (u.uswallow) {
	    /* barrier between you and the floor */
	    pline("%s %s into %s %s.", str, vtense(str, "drop"),
		  s_suffix(mon_nam(u.ustuck)), mbodypart(u.ustuck, STOMACH));
	} else {
	    pline("%s %s %s your %s!", str,
		  Blind ? "lands" : vtense(str, "appear"),
		  Levitation ? "beneath" : "at",
		  makeplural(body_part(FOOT)));
	}
}